

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string package_reference;
  string field_type;
  string field_method;
  undefined1 local_70 [8];
  string field_field;
  string struct_var;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Variable_abi_cxx11_((string *)((long)&field_field.field_2 + 8),&this->namer_,struct_def)
  ;
  IdlNamer::Field_abi_cxx11_((string *)local_70,&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>
            ((string *)((long)&field_type.field_2 + 8),&(this->namer_).super_Namer,field);
  TypeName_abi_cxx11_((string *)((long)&package_reference.field_2 + 8),this,field);
  if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
    GenPackageReference_abi_cxx11_((string *)local_e0,this,&(field->value).type);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,"."
                  );
    TypeName_abi_cxx11_(&local_140,this,field);
    std::operator+(&local_100,&local_120,&local_140);
    std::__cxx11::string::operator=
              ((string *)(package_reference.field_2._M_local_buf + 8),(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)local_e0);
  }
  GenIndents_abi_cxx11_(&local_200,this,2);
  std::operator+(&local_1e0,&local_200,"if ");
  std::operator+(&local_1c0,&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_field.field_2 + 8));
  std::operator+(&local_1a0,&local_1c0,".");
  std::operator+(&local_180,&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_type.field_2 + 8));
  std::operator+(&local_160,&local_180,"(");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  if (((struct_def->fixed & 1U) != 0) && ((field->value).type.base_type == BASE_TYPE_STRUCT)) {
    std::operator+(&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&package_reference.field_2 + 8),"()");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  std::__cxx11::string::operator+=((string *)code_ptr,") is not None:");
  GenIndents_abi_cxx11_(&local_360,this,3);
  std::operator+(&local_340,&local_360,"self.");
  std::operator+(&local_320,&local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_300,&local_320," = ");
  Namer::ObjectType(&local_380,&(this->namer_).super_Namer,
                    (string *)((long)&package_reference.field_2 + 8));
  std::operator+(&local_2e0,&local_300,&local_380);
  std::operator+(&local_2c0,&local_2e0,".InitFromObj(");
  std::operator+(&local_2a0,&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_field.field_2 + 8));
  std::operator+(&local_280,&local_2a0,".");
  std::operator+(&local_260,&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_type.field_2 + 8));
  std::operator+(&local_240,&local_260,"(");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  if (((struct_def->fixed & 1U) != 0) && ((field->value).type.base_type == BASE_TYPE_STRUCT)) {
    std::operator+(&local_3a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&package_reference.field_2 + 8),"()");
    std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  std::__cxx11::string::operator+=((string *)code_ptr,"))");
  std::__cxx11::string::~string((string *)(package_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(field_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnPackForStruct(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    auto field_type = TypeName(field);

    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(field.value.type);
      field_type = package_reference + "." + TypeName(field);
    }

    code += GenIndents(2) + "if " + struct_var + "." + field_method + "(";
    // if field is a struct, we need to create an instance for it first.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += ") is not None:";
    code += GenIndents(3) + "self." + field_field + " = " +
            namer_.ObjectType(field_type) + +".InitFromObj(" + struct_var +
            "." + field_method + "(";
    // A struct's accessor requires a struct buf instance.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += "))";
  }